

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86.cpp
# Opt level: O2

int __thiscall
ncnn::DeformableConv2D_x86::forward
          (DeformableConv2D_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  Mat *pMVar3;
  size_t _elemsize;
  Mat *this_00;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  Option *pOVar12;
  undefined8 uVar13;
  uint _w;
  int iVar14;
  _func_int *p_Var15;
  int *piVar16;
  bool bVar17;
  int _h;
  int _h_00;
  int iVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  void *pvVar26;
  int j;
  int iVar27;
  float *pfVar28;
  bool bVar29;
  float __x;
  float fVar30;
  float extraout_XMM0_Db;
  float extraout_XMM0_Dc;
  float fVar31;
  float extraout_XMM0_Dd;
  float fVar32;
  float fVar33;
  float fVar34;
  float in_XMM1_Db;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  Mat local_2a8;
  ulong local_258;
  int local_24c;
  float local_248;
  float local_244;
  float local_240;
  int local_23c;
  int local_238;
  int local_234;
  Option *local_230;
  _func_int **local_228;
  pointer local_220;
  Mat local_218;
  undefined8 local_1c8;
  float fStack_1c0;
  float fStack_1bc;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1b0;
  Mat *local_1a8;
  ulong local_1a0;
  long local_198;
  void *local_190;
  long local_188;
  long local_180;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_178;
  pointer local_170;
  void *local_168;
  void *local_160;
  DeformableConv2D_x86 *local_158;
  long local_150;
  long local_148;
  _func_int **local_140;
  _func_int **local_138;
  Mat local_130;
  float local_e8;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  Mat local_c0;
  Mat local_78;
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_220 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  local_258 = (ulong)(uint)pMVar3->w;
  iVar1 = pMVar3->h;
  p_Var15 = this->_vptr_DeformableConv2D_x86[-3];
  iVar2 = pMVar3->c;
  _elemsize = pMVar3->elemsize;
  iVar22 = (~((*(int *)(&this->field_0xd4 + (long)p_Var15) + -1) *
             *(int *)(&this->field_0xdc + (long)p_Var15)) + pMVar3->w +
            *(int *)(&this->field_0xec + (long)p_Var15) +
           *(int *)(&this->field_0xf0 + (long)p_Var15)) /
           *(int *)(&this->field_0xe4 + (long)p_Var15);
  uVar8 = (long)(~((*(int *)(&this->field_0xd8 + (long)p_Var15) + -1) *
                  *(int *)(&this->field_0xe0 + (long)p_Var15)) + iVar1 +
                 *(int *)(&this->field_0xf4 + (long)p_Var15) +
                *(int *)(&this->field_0xf8 + (long)p_Var15)) /
          (long)*(int *)(&this->field_0xe8 + (long)p_Var15);
  local_218.cstep = 0;
  _w = iVar22 + 1;
  _h = (int)uVar8 + 1;
  _h_00 = _h * _w;
  local_218.data = (void *)0x0;
  local_218.refcount._0_4_ = 0;
  local_218.refcount._4_4_ = 0;
  local_218.elemsize._0_4_ = 0;
  local_218.elemsize._4_4_ = 0;
  local_218.elempack = 0;
  local_218.allocator = (Allocator *)0x0;
  local_218.dims = 0;
  local_218.w = 0;
  local_218.h = 0;
  local_218.d = 0;
  local_218.c = 0;
  local_230 = opt;
  local_178 = bottom_blobs;
  Mat::create(&local_218,
              *(int *)(&this->field_0xd8 + (long)p_Var15) * iVar2 *
              *(int *)(&this->field_0xd4 + (long)p_Var15) * _h_00,_elemsize,opt->blob_allocator);
  iVar18 = -100;
  if ((local_218.data != (void *)0x0) && ((long)local_218.c * local_218.cstep != 0)) {
    this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_1c8 = uVar8 & 0xffffffff;
    Mat::create(this_00,*(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86[-3]),
                _h_00,_elemsize,local_230->blob_allocator);
    if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
      iVar18 = iVar1 * (int)local_258;
      local_1b0 = top_blobs;
      local_1a8 = this_00;
      Mat::reshape(&local_78,pMVar3,iVar18 * iVar2,(Allocator *)0x0);
      Mat::reshape(&local_c0,pMVar3 + 1,pMVar3[1].h * pMVar3[1].w * pMVar3[1].c,(Allocator *)0x0);
      local_220 = (pointer)((long)local_220 - (long)pMVar3);
      local_160 = local_78.data;
      fVar39 = (float)iVar1;
      local_168 = local_c0.data;
      fVar40 = (float)(int)local_258;
      local_190 = local_218.data;
      local_24c = (int)local_258 + -1;
      local_23c = 0;
      if (0 < iVar2) {
        local_23c = iVar2;
      }
      local_180 = (long)iVar22;
      local_1a0 = (ulong)_w;
      local_198 = (long)(int)local_1c8;
      fVar35 = extraout_XMM0_Db;
      fVar31 = extraout_XMM0_Dc;
      fVar32 = extraout_XMM0_Dd;
      local_248 = fVar40;
      local_244 = fVar39;
      local_158 = this;
      for (lVar19 = 0; lVar19 <= local_198; lVar19 = lVar19 + 1) {
        local_228 = this->_vptr_DeformableConv2D_x86;
        local_188 = lVar19 * local_1a0;
        local_150 = lVar19;
        for (lVar20 = 0; lVar20 <= local_180; lVar20 = lVar20 + 1) {
          p_Var15 = local_228[-3];
          local_234 = *(int *)(&this->field_0xe8 + (long)p_Var15) * (int)lVar19 -
                      *(int *)(&this->field_0xf4 + (long)p_Var15);
          local_238 = *(int *)(&this->field_0xe4 + (long)p_Var15) * (int)lVar20 -
                      *(int *)(&this->field_0xec + (long)p_Var15);
          pfVar28 = (float *)((long)local_190 +
                             (long)(((int)local_188 + (int)lVar20) * iVar2 *
                                    *(int *)(&this->field_0xd8 + (long)p_Var15) *
                                   *(int *)(&this->field_0xd4 + (long)p_Var15)) * 4);
          local_138 = this->_vptr_DeformableConv2D_x86;
          local_148 = lVar20;
          for (iVar22 = 0; iVar22 < *(int *)(&this->field_0xd8 + (long)p_Var15); iVar22 = iVar22 + 1
              ) {
            local_170 = (local_178->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
            local_140 = this->_vptr_DeformableConv2D_x86;
            for (iVar27 = 0; iVar27 < *(int *)(&this->field_0xd4 + (long)local_138[-3]);
                iVar27 = iVar27 + 1) {
              iVar14 = *(int *)(&this->field_0xd4 + (long)local_138[-3]) * iVar22 + iVar27;
              fVar41 = 1.0;
              if (local_220 == (pointer)0xd8) {
                fVar41 = *(float *)((long)local_170[2].data +
                                   lVar20 * 4 +
                                   local_170[2].w * lVar19 * local_170[2].elemsize +
                                   (long)iVar14 * local_170[2].cstep * local_170[2].elemsize);
              }
              __x = (float)(*(int *)(&this->field_0xe0 + (long)local_140[-3]) * iVar22 + local_234)
                    + *(float *)((long)local_168 +
                                (long)(int)((iVar14 * 2 * _h + (int)lVar19) * _w + (int)lVar20) * 4)
              ;
              fVar33 = (float)(*(int *)(&this->field_0xdc + (long)local_140[-3]) * iVar27 +
                              local_238) +
                       *(float *)((long)local_168 +
                                 (long)(int)(((iVar14 * 2 + 1) * _h + (int)lVar19) * _w +
                                            (int)lVar20) * 4);
              bVar6 = fVar39 <= __x;
              bVar7 = fVar40 <= fVar33;
              if ((bVar7 || bVar6) || (fVar33 <= -1.0 || __x <= -1.0)) {
                fVar30 = 0.0;
                fVar35 = 0.0;
                fVar31 = 0.0;
                fVar32 = 0.0;
                bVar29 = false;
                bVar10 = false;
                bVar9 = false;
                bVar17 = false;
                lVar19 = 0;
                lVar20 = 0;
                lVar23 = 0;
                lVar24 = 0;
                pvVar26 = local_160;
                iVar14 = local_23c;
              }
              else {
                local_1c8 = CONCAT44(in_XMM1_Db,fVar33);
                local_240 = fVar41;
                fStack_1c0 = in_XMM1_Dc;
                fStack_1bc = in_XMM1_Dd;
                local_d8 = __x;
                fStack_d4 = fVar35;
                fStack_d0 = fVar31;
                fStack_cc = fVar32;
                local_e8 = floorf(__x);
                uVar25 = (uint)local_e8;
                fVar40 = floorf((float)local_1c8);
                uVar21 = (uint)fVar40;
                fVar35 = local_d8 - (float)(int)local_e8;
                fVar40 = (float)local_1c8 - (float)(int)uVar21;
                in_XMM1_Dc = 1.0 - fVar35;
                in_XMM1_Dd = 0.0 - fStack_d4;
                bVar4 = (int)uVar21 < local_24c;
                bVar10 = -1 < (int)uVar25 && bVar4;
                bVar5 = (int)uVar25 < iVar1 + -1;
                bVar9 = -1 < (int)uVar21 && bVar5;
                bVar17 = bVar5 && bVar4;
                iVar14 = (int)local_258 * uVar25;
                bVar29 = -1 < (int)(uVar25 | uVar21);
                lVar19 = (long)(int)(iVar14 + uVar21);
                if (!bVar29) {
                  lVar19 = 0;
                }
                lVar20 = (long)(int)(iVar14 + uVar21 + 1);
                if (-1 >= (int)uVar25 || !bVar4) {
                  lVar20 = 0;
                }
                iVar14 = (uVar25 + 1) * (int)local_258;
                lVar23 = (long)(int)(uVar21 + iVar14);
                if (-1 >= (int)uVar21 || !bVar5) {
                  lVar23 = 0;
                }
                lVar24 = (long)(int)(iVar14 + uVar21 + 1);
                if (!bVar5 || !bVar4) {
                  lVar24 = 0;
                }
                in_XMM1_Db = 0.0;
                fVar30 = (1.0 - fVar40) * fVar35;
                fVar35 = fVar35 * fVar40;
                fVar31 = fVar40 * in_XMM1_Dc;
                fVar32 = in_XMM1_Dc * (1.0 - fVar40);
                pvVar26 = local_160;
                iVar14 = local_23c;
                fVar41 = local_240;
                fVar40 = local_248;
                fVar39 = local_244;
              }
              while (iVar14 != 0) {
                fVar34 = 0.0;
                in_XMM1_Db = 0.0;
                if ((!bVar7 && !bVar6) && (fVar33 > -1.0 && __x > -1.0)) {
                  fVar36 = 0.0;
                  if (bVar29) {
                    fVar36 = *(float *)((long)pvVar26 + lVar19 * 4);
                  }
                  if (bVar10) {
                    fVar34 = *(float *)((long)pvVar26 + lVar20 * 4);
                  }
                  fVar38 = 0.0;
                  fVar37 = 0.0;
                  if (bVar9) {
                    fVar37 = *(float *)((long)pvVar26 + lVar23 * 4);
                  }
                  if (bVar17) {
                    fVar38 = *(float *)((long)pvVar26 + lVar24 * 4);
                  }
                  in_XMM1_Db = fVar36 * fVar32 + fVar38 * fVar35;
                  fVar34 = in_XMM1_Db + fVar34 * fVar31 + fVar37 * fVar30;
                }
                *pfVar28 = fVar34 * fVar41;
                pfVar28 = pfVar28 + 1;
                pvVar26 = (void *)((long)pvVar26 + (long)iVar18 * 4);
                in_XMM1_Dc = in_XMM1_Db;
                in_XMM1_Dd = in_XMM1_Db;
                iVar14 = iVar14 + -1;
              }
              lVar19 = local_150;
              lVar20 = local_148;
              this = local_158;
            }
            p_Var15 = local_228[-3];
          }
        }
      }
      Mat::reshape(&local_2a8,&local_218,
                   iVar2 * *(int *)(&this->field_0xd8 + (long)this->_vptr_DeformableConv2D_x86[-3])
                   * *(int *)(&this->field_0xd4 + (long)this->_vptr_DeformableConv2D_x86[-3]),_h_00,
                   (Allocator *)0x0);
      pOVar12 = local_230;
      piVar16 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + 1;
        UNLOCK();
      }
      piVar16 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (local_218.allocator == (Allocator *)0x0) {
            free(local_218.data);
          }
          else {
            (*(local_218.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar16 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
      local_218.data = local_2a8.data;
      local_218.refcount._0_4_ = local_2a8.refcount._0_4_;
      local_218.refcount._4_4_ = local_2a8.refcount._4_4_;
      local_218.elemsize._0_4_ = (undefined4)local_2a8.elemsize;
      local_218.elemsize._4_4_ = local_2a8.elemsize._4_4_;
      local_218.elempack = local_2a8.elempack;
      local_218.allocator = local_2a8.allocator;
      local_218.dims = local_2a8.dims;
      local_218.w = local_2a8.w;
      local_218.h = local_2a8.h;
      uVar11._0_4_ = local_2a8.d;
      uVar11._4_4_ = local_2a8.c;
      local_218.d = local_2a8.d;
      local_218.c = local_2a8.c;
      local_218.cstep = local_2a8.cstep;
      uVar13 = uVar11;
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        uVar13 = local_218._52_8_;
        if (*piVar16 == 0) {
          local_218._52_8_ = uVar11;
          if (local_2a8.allocator == (Allocator *)0x0) {
            free(local_2a8.data);
            uVar13 = local_218._52_8_;
          }
          else {
            (*(local_2a8.allocator)->_vptr_Allocator[3])();
            uVar13 = local_218._52_8_;
          }
        }
      }
      local_218._52_8_ = uVar13;
      pMVar3 = local_1a8;
      (*this->inner_product->_vptr_Layer[7])(this->inner_product,&local_218,local_1a8,pOVar12);
      local_2a8.cstep = 0;
      local_2a8.data = (void *)0x0;
      local_2a8.refcount._0_4_ = 0;
      local_2a8.refcount._4_4_ = 0;
      local_2a8.elemsize._0_4_ = 0;
      local_2a8.elemsize._4_4_ = 0;
      local_2a8.elempack = 0;
      local_2a8.allocator = (Allocator *)0x0;
      local_2a8.dims = 0;
      local_2a8.w = 0;
      local_2a8.h = 0;
      local_2a8.d = 0;
      local_2a8.c = 0;
      (*this->permute->_vptr_Layer[7])(this->permute,pMVar3,&local_2a8,pOVar12);
      Mat::reshape(&local_130,&local_2a8,_w,_h,
                   *(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86[-3]),
                   (Allocator *)0x0);
      if (local_130.refcount != (int *)0x0) {
        LOCK();
        *local_130.refcount = *local_130.refcount + 1;
        UNLOCK();
      }
      piVar16 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (local_2a8.allocator == (Allocator *)0x0) {
            free(local_2a8.data);
          }
          else {
            (*(local_2a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_2a8.data = local_130.data;
      local_2a8.refcount._0_4_ = SUB84(local_130.refcount,0);
      local_2a8.refcount._4_4_ = (undefined4)((ulong)local_130.refcount >> 0x20);
      local_2a8.elemsize._0_4_ = (undefined4)local_130.elemsize;
      local_2a8.elemsize._4_4_ = (undefined4)(local_130.elemsize >> 0x20);
      local_2a8.elempack = local_130.elempack;
      local_2a8.allocator = local_130.allocator;
      local_2a8.dims = local_130.dims;
      local_2a8.w = local_130.w;
      local_2a8.h = local_130.h;
      local_2a8.c = local_130.c;
      local_2a8.d = local_130.d;
      local_2a8.cstep = local_130.cstep;
      if (local_130.refcount != (int *)0x0) {
        LOCK();
        *local_130.refcount = *local_130.refcount + -1;
        UNLOCK();
        if (*local_130.refcount == 0) {
          if (local_130.allocator == (Allocator *)0x0) {
            free(local_130.data);
          }
          else {
            (*(local_130.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      pMVar3 = (local_1b0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar16 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
      if (pMVar3 != &local_2a8) {
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + 1;
          UNLOCK();
        }
        piVar16 = pMVar3->refcount;
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if (pMVar3->allocator == (Allocator *)0x0) {
              free(pMVar3->data);
            }
            else {
              (*pMVar3->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar3->cstep = 0;
        pMVar3->data = (void *)0x0;
        pMVar3->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar3->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar3->elemsize + 4) = 0;
        pMVar3->dims = 0;
        pMVar3->w = 0;
        pMVar3->h = 0;
        pMVar3->d = 0;
        pMVar3->c = 0;
        pMVar3->data = local_2a8.data;
        piVar16 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
        pMVar3->refcount = piVar16;
        pMVar3->elemsize = CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize);
        pMVar3->elempack = local_2a8.elempack;
        pMVar3->allocator = local_2a8.allocator;
        pMVar3->dims = local_2a8.dims;
        pMVar3->w = local_2a8.w;
        pMVar3->h = local_2a8.h;
        pMVar3->d = local_2a8.d;
        pMVar3->c = local_2a8.c;
        pMVar3->cstep = local_2a8.cstep;
      }
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (local_2a8.allocator == (Allocator *)0x0) {
            free(local_2a8.data);
          }
          else {
            (*(local_2a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_c0.refcount != (int *)0x0) {
        LOCK();
        *local_c0.refcount = *local_c0.refcount + -1;
        UNLOCK();
        if (*local_c0.refcount == 0) {
          if (local_c0.allocator == (Allocator *)0x0) {
            free(local_c0.data);
          }
          else {
            (*(local_c0.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            free(local_78.data);
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar18 = 0;
    }
  }
  piVar16 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
  if (piVar16 != (int *)0x0) {
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 == 0) {
      if (local_218.allocator == (Allocator *)0x0) {
        free(local_218.data);
      }
      else {
        (*(local_218.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar18;
}

Assistant:

int DeformableConv2D_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& offset = bottom_blobs[1];

    const bool has_mask = (bottom_blobs.size() == 3);

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int in_c = bottom_blob.c;
    const size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int out_w = (w + pad_left + pad_right - kernel_extent_w) / stride_w + 1;
    const int out_h = (h + pad_top + pad_bottom - kernel_extent_h) / stride_h + 1;

    // output = im2col matmul weight_t, im2col.shape is [out_h * out_w, kernel_h * kernel_w * in_c] (in python),
    // weight_t.shape is [num_output, kernel_h * kernel_w * in_c] (in python),
    // output.shape   is [out_h * out_w, num_output] (in python).
    Mat im2col;
    im2col.create(kernel_h * kernel_w * in_c * out_h * out_w, elemsize, opt.blob_allocator);
    if (im2col.empty())
        return -100;

    Mat& output = top_blobs[0];
    output.create(num_output, out_h * out_w, elemsize, opt.blob_allocator);
    if (output.empty())
        return -100;

    Mat bottom_blob_flatten = bottom_blob.reshape(w * h * in_c);
    Mat offset_flatten = offset.reshape(offset.w * offset.h * offset.c);
    const float* data_im_ptr = bottom_blob_flatten;
    const float* data_offset_ptr = offset_flatten;
    float* im2col_ptr = im2col;

    // im2col
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int h_col = 0; h_col < out_h; h_col++)
    {
        for (int w_col = 0; w_col < out_w; w_col++)
        {
            int h_in = h_col * stride_h - pad_top;
            int w_in = w_col * stride_w - pad_left;
            float* data_col_ptr = im2col_ptr + (h_col * out_w + w_col) * kernel_h * kernel_w * in_c;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    const int data_offset_h_ptr = (((i * kernel_w + j) * 2) * out_h + h_col) * out_w + w_col;
                    const int data_offset_w_ptr = (((i * kernel_w + j) * 2 + 1) * out_h + h_col) * out_w + w_col;

                    const float offset_h = data_offset_ptr[data_offset_h_ptr];
                    const float offset_w = data_offset_ptr[data_offset_w_ptr];
                    const float mask_ = has_mask ? bottom_blobs[2].channel(i * kernel_w + j).row(h_col)[w_col] : 1.f;
                    const float h_im = h_in + i * dilation_h + offset_h;
                    const float w_im = w_in + j * dilation_w + offset_w;

                    // Bilinear
                    const bool cond = h_im > -1 && w_im > -1 && h_im < h && w_im < w;
                    float w1 = 0.f;
                    float w2 = 0.f;
                    float w3 = 0.f;
                    float w4 = 0.f;
                    bool v1_cond = false;
                    bool v2_cond = false;
                    bool v3_cond = false;
                    bool v4_cond = false;
                    int v1_pos = 0;
                    int v2_pos = 0;
                    int v3_pos = 0;
                    int v4_pos = 0;
                    if (cond)
                    {
                        int h_low = floor(h_im);
                        int w_low = floor(w_im);
                        int h_high = h_low + 1;
                        int w_high = w_low + 1;

                        float lh = h_im - h_low;
                        float lw = w_im - w_low;
                        float hh = 1 - lh;
                        float hw = 1 - lw;

                        v1_cond = (h_low >= 0 && w_low >= 0);
                        v2_cond = (h_low >= 0 && w_high <= w - 1);
                        v3_cond = (h_high <= h - 1 && w_low >= 0);
                        v4_cond = (h_high <= h - 1 && w_high <= w - 1);
                        if (v1_cond)
                            v1_pos = h_low * w + w_low;
                        if (v2_cond)
                            v2_pos = h_low * w + w_high;
                        if (v3_cond)
                            v3_pos = h_high * w + w_low;
                        if (v4_cond)
                            v4_pos = h_high * w + w_high;

                        w1 = hh * hw;
                        w2 = hh * lw;
                        w3 = lh * hw;
                        w4 = lh * lw;
                    }

                    const float* data_im_channel_ptr = data_im_ptr;
                    for (int c_im = 0; c_im < in_c; c_im++)
                    {
                        float val = 0.f;
                        if (cond)
                        {
                            float v1 = v1_cond ? data_im_channel_ptr[v1_pos] : 0.f;
                            float v2 = v2_cond ? data_im_channel_ptr[v2_pos] : 0.f;
                            float v3 = v3_cond ? data_im_channel_ptr[v3_pos] : 0.f;
                            float v4 = v4_cond ? data_im_channel_ptr[v4_pos] : 0.f;
                            val = w1 * v1 + w2 * v2 + w3 * v3 + w4 * v4;
                        }
                        *data_col_ptr = val * mask_;
                        data_col_ptr += 1;
                        data_im_channel_ptr += h * w;
                    }
                }
            }
        }
    }
    im2col = im2col.reshape(kernel_h * kernel_w * in_c, out_h * out_w);
    // call InnerProduct
    inner_product->forward(im2col, output, opt);
    ncnn::Mat output_t;
    // call Permute
    permute->forward(output, output_t, opt);
    output_t = output_t.reshape(out_w, out_h, num_output);
    top_blobs[0] = output_t;
    return 0;
}